

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O1

qpdf_offset_t __thiscall QPDF::read_xrefTable(QPDF *this,qpdf_offset_t xref_offset)

{
  pointer pcVar1;
  InputSource *this_00;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var2;
  bool bVar3;
  int iVar4;
  qpdf_offset_t qVar5;
  undefined8 uVar6;
  longlong lVar7;
  long *plVar8;
  QPDFExc *pQVar9;
  element_type *peVar10;
  ulong __val;
  QPDF *this_01;
  long lVar11;
  char type;
  int f2;
  int bytes;
  int num;
  int obj;
  QPDFObjectHandle cur_trailer;
  qpdf_offset_t f1;
  string line;
  char local_151;
  undefined1 local_150 [16];
  undefined1 local_140 [24];
  undefined1 local_128 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  _Alloc_hider local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  _Alloc_hider local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  int local_bc;
  int local_b8;
  int local_b4;
  string local_b0;
  qpdf_offset_t local_90;
  string local_88;
  qpdf_offset_t local_68;
  pointer local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  string local_50;
  
  plVar8 = *(long **)&(((this->m)._M_t.
                        super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                        .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                      super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
  local_68 = xref_offset;
  (**(code **)(*plVar8 + 0x28))(plVar8,xref_offset,0);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  while( true ) {
    std::__cxx11::string::_M_replace_aux((ulong)&local_88,0,local_88._M_string_length,'2');
    this_01 = *(QPDF **)&(((this->m)._M_t.
                           super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                           .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                         super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
    (*(code *)(((this_01->m)._M_t.
                super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->tokenizer).val.field_2.
              _M_allocated_capacity)(this_01,local_88._M_dataplus._M_p,local_88._M_string_length);
    local_b4 = 0;
    local_b8 = 0;
    local_bc = 0;
    bVar3 = parse_xrefFirst(this_01,&local_88,&local_b4,&local_b8,&local_bc);
    if (!bVar3) {
      pQVar9 = (QPDFExc *)__cxa_allocate_exception(0x80);
      local_128._0_8_ = local_128 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"xref table","");
      local_150._0_8_ = local_140;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"xref syntax invalid","");
      damagedPDF(pQVar9,this,(string *)local_128,(string *)local_150);
      __cxa_throw(pQVar9,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    this_00 = (((this->m)._M_t.
                super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
              super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    qVar5 = InputSource::getLastOffset(this_00);
    (*this_00->_vptr_InputSource[5])(this_00,qVar5 + local_bc,0);
    if (0 < (long)local_b8) {
      __val = (ulong)local_b4;
      lVar11 = (long)local_b8 + __val;
      do {
        if (__val == 0) {
          qVar5 = (**(code **)(**(long **)&(((this->m)._M_t.
                                             super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                             .super__Head_base<0UL,_QPDF::Members_*,_false>.
                                            _M_head_impl)->file).
                                           super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>
                              + 0x20))();
          ((this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
           _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
           super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->first_xref_item_offset =
               qVar5;
        }
        local_90 = 0;
        local_140._20_4_ = 0;
        local_151 = '\0';
        bVar3 = read_xrefEntry(this,&local_90,(int *)(local_140 + 0x14),&local_151);
        if (!bVar3) {
          pQVar9 = (QPDFExc *)__cxa_allocate_exception(0x80);
          local_128._0_8_ = local_128 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"xref table","");
          std::__cxx11::to_string(&local_50,__val);
          std::operator+(&local_b0,"invalid xref entry (obj=",&local_50);
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_b0);
          local_150._0_8_ = *plVar8;
          peVar10 = (element_type *)(plVar8 + 2);
          if ((element_type *)local_150._0_8_ == peVar10) {
            local_140._0_8_ =
                 *(undefined8 *)
                  &(peVar10->value).
                   super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                   .
                   super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                   .
                   super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                   .
                   super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                   .
                   super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                   .
                   super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
            ;
            local_140._8_8_ = plVar8[3];
            local_150._0_8_ = (element_type *)local_140;
          }
          else {
            local_140._0_8_ =
                 *(undefined8 *)
                  &(peVar10->value).
                   super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                   .
                   super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                   .
                   super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                   .
                   super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                   .
                   super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                   .
                   super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
            ;
          }
          local_150._8_8_ = plVar8[1];
          *plVar8 = (long)peVar10;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          damagedPDF(pQVar9,this,(string *)local_128,(string *)local_150);
          __cxa_throw(pQVar9,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
        }
        if (local_151 == 'f') {
          if (__val - 0x80000000 < 0xffffffff00000000) {
            QIntC::IntConverter<long_long,_int,_true,_true>::error(__val);
          }
          insertFreeXrefEntry(this,(QPDFObjGen)
                                   (__val & 0xffffffff | (ulong)(uint)local_140._20_4_ << 0x20));
        }
        else {
          if (__val - 0x80000000 < 0xffffffff00000000) {
            QIntC::IntConverter<long_long,_int,_true,_true>::error(__val);
          }
          insertXrefEntry(this,(int)__val,1,local_90,local_140._20_4_);
        }
        __val = __val + 1;
      } while ((long)__val < lVar11);
    }
    uVar6 = (**(code **)(**(long **)&(((this->m)._M_t.
                                       super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                       .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)
                                     ->file).
                                     super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> +
                        0x20))();
    _Var2._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    ::qpdf::Tokenizer::readToken
              ((Token *)local_128,&(_Var2._M_head_impl)->tokenizer,
               ((_Var2._M_head_impl)->file).
               super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &(_Var2._M_head_impl)->last_object_description,true,0);
    local_150._0_8_ = local_140;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"trailer","");
    if ((local_128._0_4_ == tt_word) && (local_128._16_8_ == local_150._8_8_)) {
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._16_8_ ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        bVar3 = true;
      }
      else {
        iVar4 = bcmp((void *)local_128._8_8_,(void *)local_150._0_8_,local_128._16_8_);
        bVar3 = iVar4 == 0;
      }
    }
    else {
      bVar3 = false;
    }
    if ((element_type *)local_150._0_8_ != (element_type *)local_140) {
      operator_delete((void *)local_150._0_8_,local_140._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_p != &local_d0) {
      operator_delete(local_e0._M_p,local_d0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_p != &local_f0) {
      operator_delete(local_100._M_p,local_f0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._8_8_ != &local_110) {
      operator_delete((void *)local_128._8_8_,local_110._M_allocated_capacity + 1);
    }
    if (bVar3) break;
    plVar8 = *(long **)&(((this->m)._M_t.
                          super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                          .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                        super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
    (**(code **)(*plVar8 + 0x28))(plVar8,uVar6,0);
  }
  readTrailer((QPDF *)&local_b0);
  bVar3 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)&local_b0);
  if (!bVar3) {
    pQVar9 = (QPDFExc *)__cxa_allocate_exception(0x80);
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"");
    local_150._0_8_ = local_140;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_150,"expected trailer dictionary","");
    damagedPDF(pQVar9,this,(string *)local_128,(string *)local_150);
    __cxa_throw(pQVar9,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  if (*(long *)&(((this->m)._M_t.
                  super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                  super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                  super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->trailer).
                super_BaseHandle == 0) {
    local_60 = local_b0._M_dataplus._M_p;
    local_58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._M_string_length;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_b0._M_string_length + 8) =
             *(_Atomic_word *)(local_b0._M_string_length + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_b0._M_string_length + 8) =
             *(_Atomic_word *)(local_b0._M_string_length + 8) + 1;
      }
    }
    _Var2._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    if (*(long *)&((_Var2._M_head_impl)->trailer).super_BaseHandle == 0) {
      *(pointer *)&((_Var2._M_head_impl)->trailer).super_BaseHandle = local_b0._M_dataplus._M_p;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&((_Var2._M_head_impl)->trailer).super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,&local_58);
    }
    if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
    }
    _Var2._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    pcVar1 = local_128 + 0x10;
    local_128._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"/Size","");
    bVar3 = QPDFObjectHandle::hasKey(&(_Var2._M_head_impl)->trailer,(string *)local_128);
    if ((pointer)local_128._0_8_ != pcVar1) {
      operator_delete((void *)local_128._0_8_,(ulong)(local_128._16_8_ + 1));
    }
    if (!bVar3) {
      pQVar9 = (QPDFExc *)__cxa_allocate_exception(0x80);
      local_128._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"trailer","");
      local_150._0_8_ = local_140;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_150,"trailer dictionary lacks /Size key","");
      damagedPDF(pQVar9,this,(string *)local_128,(string *)local_150);
      __cxa_throw(pQVar9,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    _Var2._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    local_128._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"/Size","");
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_150,(string *)&(_Var2._M_head_impl)->trailer)
    ;
    bVar3 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)local_150);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._8_8_);
    }
    if ((pointer)local_128._0_8_ != pcVar1) {
      operator_delete((void *)local_128._0_8_,(ulong)(local_128._16_8_ + 1));
    }
    if (!bVar3) {
      pQVar9 = (QPDFExc *)__cxa_allocate_exception(0x80);
      local_128._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"trailer","");
      local_150._0_8_ = local_140;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_150,"/Size key in trailer dictionary is not an integer","");
      damagedPDF(pQVar9,this,(string *)local_128,(string *)local_150);
      __cxa_throw(pQVar9,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
  }
  pcVar1 = local_128 + 0x10;
  local_128._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"/XRefStm","");
  bVar3 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)&local_b0,(string *)local_128);
  if ((pointer)local_128._0_8_ != pcVar1) {
    operator_delete((void *)local_128._0_8_,(ulong)(local_128._16_8_ + 1));
  }
  if ((bVar3) &&
     (((this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->ignore_xref_streams == false)) {
    local_128._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"/XRefStm","");
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_150,&local_b0);
    bVar3 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)local_150);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._8_8_);
    }
    if ((pointer)local_128._0_8_ != pcVar1) {
      operator_delete((void *)local_128._0_8_,(ulong)(local_128._16_8_ + 1));
    }
    if (!bVar3) {
      pQVar9 = (QPDFExc *)__cxa_allocate_exception(0x80);
      local_128._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"xref stream","");
      local_150._0_8_ = local_140;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"invalid /XRefStm","");
      damagedPDF(pQVar9,this,(string *)local_128,local_68,(string *)local_150);
      __cxa_throw(pQVar9,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    local_128._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"/XRefStm","");
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_150,&local_b0);
    lVar7 = QPDFObjectHandle::getIntValue((QPDFObjectHandle *)local_150);
    read_xrefStream(this,lVar7);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._8_8_);
    }
    if ((pointer)local_128._0_8_ != pcVar1) {
      operator_delete((void *)local_128._0_8_,(ulong)(local_128._16_8_ + 1));
    }
  }
  local_128._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"/Prev","");
  bVar3 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)&local_b0,(string *)local_128);
  if ((pointer)local_128._0_8_ != pcVar1) {
    operator_delete((void *)local_128._0_8_,(ulong)(local_128._16_8_ + 1));
  }
  if (bVar3) {
    local_128._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"/Prev","");
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_150,&local_b0);
    bVar3 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)local_150);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._8_8_);
    }
    if ((pointer)local_128._0_8_ != pcVar1) {
      operator_delete((void *)local_128._0_8_,(ulong)(local_128._16_8_ + 1));
    }
    if (!bVar3) {
      pQVar9 = (QPDFExc *)__cxa_allocate_exception(0x80);
      local_128._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"trailer","");
      local_150._0_8_ = local_140;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_150,"/Prev key in trailer dictionary is not an integer","");
      damagedPDF(pQVar9,this,(string *)local_128,(string *)local_150);
      __cxa_throw(pQVar9,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    local_128._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"/Prev","");
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_150,&local_b0);
    lVar7 = QPDFObjectHandle::getIntValue((QPDFObjectHandle *)local_150);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._8_8_);
    }
    if ((pointer)local_128._0_8_ != pcVar1) {
      operator_delete((void *)local_128._0_8_,(ulong)(local_128._16_8_ + 1));
    }
  }
  else {
    lVar7 = 0;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                             local_88.field_2._M_local_buf[0]) + 1);
  }
  return lVar7;
}

Assistant:

qpdf_offset_t
QPDF::read_xrefTable(qpdf_offset_t xref_offset)
{
    m->file->seek(xref_offset, SEEK_SET);
    std::string line;
    while (true) {
        line.assign(50, '\0');
        m->file->read(line.data(), line.size());
        int obj = 0;
        int num = 0;
        int bytes = 0;
        if (!parse_xrefFirst(line, obj, num, bytes)) {
            QTC::TC("qpdf", "QPDF invalid xref");
            throw damagedPDF("xref table", "xref syntax invalid");
        }
        m->file->seek(m->file->getLastOffset() + bytes, SEEK_SET);
        for (qpdf_offset_t i = obj; i - num < obj; ++i) {
            if (i == 0) {
                // This is needed by checkLinearization()
                m->first_xref_item_offset = m->file->tell();
            }
            // For xref_table, these will always be small enough to be ints
            qpdf_offset_t f1 = 0;
            int f2 = 0;
            char type = '\0';
            if (!read_xrefEntry(f1, f2, type)) {
                QTC::TC("qpdf", "QPDF invalid xref entry");
                throw damagedPDF(
                    "xref table", "invalid xref entry (obj=" + std::to_string(i) + ")");
            }
            if (type == 'f') {
                insertFreeXrefEntry(QPDFObjGen(toI(i), f2));
            } else {
                insertXrefEntry(toI(i), 1, f1, f2);
            }
        }
        qpdf_offset_t pos = m->file->tell();
        if (readToken(*m->file).isWord("trailer")) {
            break;
        } else {
            m->file->seek(pos, SEEK_SET);
        }
    }

    // Set offset to previous xref table if any
    QPDFObjectHandle cur_trailer = readTrailer();
    if (!cur_trailer.isDictionary()) {
        QTC::TC("qpdf", "QPDF missing trailer");
        throw damagedPDF("", "expected trailer dictionary");
    }

    if (!m->trailer) {
        setTrailer(cur_trailer);

        if (!m->trailer.hasKey("/Size")) {
            QTC::TC("qpdf", "QPDF trailer lacks size");
            throw damagedPDF("trailer", "trailer dictionary lacks /Size key");
        }
        if (!m->trailer.getKey("/Size").isInteger()) {
            QTC::TC("qpdf", "QPDF trailer size not integer");
            throw damagedPDF("trailer", "/Size key in trailer dictionary is not an integer");
        }
    }

    if (cur_trailer.hasKey("/XRefStm")) {
        if (m->ignore_xref_streams) {
            QTC::TC("qpdf", "QPDF ignoring XRefStm in trailer");
        } else {
            if (cur_trailer.getKey("/XRefStm").isInteger()) {
                // Read the xref stream but disregard any return value -- we'll use our trailer's
                // /Prev key instead of the xref stream's.
                (void)read_xrefStream(cur_trailer.getKey("/XRefStm").getIntValue());
            } else {
                throw damagedPDF("xref stream", xref_offset, "invalid /XRefStm");
            }
        }
    }

    if (cur_trailer.hasKey("/Prev")) {
        if (!cur_trailer.getKey("/Prev").isInteger()) {
            QTC::TC("qpdf", "QPDF trailer prev not integer");
            throw damagedPDF("trailer", "/Prev key in trailer dictionary is not an integer");
        }
        QTC::TC("qpdf", "QPDF prev key in trailer dictionary");
        return cur_trailer.getKey("/Prev").getIntValue();
    }

    return 0;
}